

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstDumper.cc
# Opt level: O1

int __thiscall mcc::AstDumper::Visit(AstDumper *this,Label *label)

{
  element_type *peVar1;
  ostream *poVar2;
  int iVar3;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  iVar3 = this->spaces_ + 2;
  this->spaces_ = iVar3;
  poVar2 = this->out_;
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)iVar3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<label>",7);
  peVar1 = (label->super_Stmt).token_.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(peVar1->identifier_)._M_dataplus._M_p,
                      (peVar1->identifier_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</label>\n",9);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  this->spaces_ = this->spaces_ + -2;
  return 0;
}

Assistant:

int AstDumper::Visit(Label &label) {
  spaces_ += TAB_SIZE;
  out_ << std::string(spaces_, ' ') << "<label>"
       << label.token_->String() << "</label>\n";
  spaces_ -= TAB_SIZE;
  return 0;
}